

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setExcludeGroupFilter_Test::
~TEST_CommandLineArguments_setExcludeGroupFilter_Test
          (TEST_CommandLineArguments_setExcludeGroupFilter_Test *this)

{
  TEST_CommandLineArguments_setExcludeGroupFilter_Test *this_local;
  
  ~TEST_CommandLineArguments_setExcludeGroupFilter_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(CommandLineArguments, setExcludeGroupFilter)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-xg", "group" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.invertMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
}